

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,ExtendedClassDeclaration *ptr)

{
  pointer ppDVar1;
  Declaration *second;
  pointer ppDVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_90,"Class Declaration: ",(ptr->super_Class_declaration).name);
  std::operator+(&local_50,&local_90,". Extended by ");
  std::operator+(&local_70,&local_50,ptr->base);
  box(this,ptr,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  ppDVar1 = (ptr->super_Class_declaration).decls.
            super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppDVar2 = (ptr->super_Class_declaration).decls.
                 super__Vector_base<Declaration_*,_std::allocator<Declaration_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppDVar2 != ppDVar1; ppDVar2 = ppDVar2 + 1) {
    second = *ppDVar2;
    arrow(this,ptr,second);
    (**(second->super_Base)._vptr_Base)(second,this);
  }
  return;
}

Assistant:

void gv_visitor::visit(ExtendedClassDeclaration* ptr) {
    box(ptr, "Class Declaration: " + *ptr->name + ". Extended by " + *ptr->base);

    for(auto i : ptr->decls) {
        arrow(ptr, i);
        i->accept(this);
    }
    
    //name, base
}